

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec-ops.c
# Opt level: O0

int main(int argc,char **argv)

{
  axbStatus_t aVar1;
  int err_check_12388123_3;
  int err_check_12388123_2;
  axbOpBackend_s *op_backend;
  axbMemBackend_s *paStack_40;
  int err_check_12388123_1;
  axbMemBackend_s *mem_backend;
  char *pcStack_30;
  int err_check_12388123;
  char *op_backend_name;
  char *mem_backend_name;
  axbHandle_s *axbHandle;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  op_backend_name = argv[1];
  pcStack_30 = argv[2];
  axbHandle = (axbHandle_s *)argv;
  argv_local._0_4_ = argc;
  if (argc < 2) {
    fprintf(_stderr,"Missing argument: MemoryBackend\n");
    argv_local._4_4_ = 1;
  }
  else {
    if (argc == 2) {
      pcStack_30 = argv[1];
    }
    printf("Initializing libaxb...\n");
    mem_backend._4_4_ = axbInit((axbHandle_s **)&mem_backend_name);
    if (mem_backend._4_4_ == 0) {
      op_backend._4_4_ =
           axbMemBackendGetByName
                     ((axbHandle_s *)mem_backend_name,&stack0xffffffffffffffc0,op_backend_name);
      if (op_backend._4_4_ == 0) {
        if (paStack_40 == (axbMemBackend_s *)0x0) {
          fprintf(_stderr,"ERROR: Cannot find memory backend %s\n",op_backend_name);
          argv_local._4_4_ = 1;
        }
        else {
          printf("Using memory backend %s\n",op_backend_name);
          aVar1 = axbOpBackendGetByName
                            ((axbHandle_s *)mem_backend_name,
                             (axbOpBackend_s **)&err_check_12388123_3,pcStack_30);
          if (aVar1 == 0) {
            if (_err_check_12388123_3 == (axbOpBackend_s *)0x0) {
              fprintf(_stderr,"ERROR: Cannot find memory backend %s\n",op_backend_name);
              argv_local._4_4_ = 1;
            }
            else {
              printf("Using op backend %s\n",pcStack_30);
              setup((axbHandle_s *)mem_backend_name,paStack_40,_err_check_12388123_3);
              printf("Shutting down libaxb...\n");
              aVar1 = axbFinalize((axbHandle_s *)mem_backend_name);
              if (aVar1 == 0) {
                printf("Completed successfully\n");
                argv_local._4_4_ = 0;
              }
              else {
                fprintf(_stderr,"Failure in line %d in file %s\n",0x113,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/tests/src/vec-ops.c"
                       );
                argv_local._4_4_ = aVar1;
              }
            }
          }
          else {
            fprintf(_stderr,"Failure in line %d in file %s\n",0x108,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/tests/src/vec-ops.c"
                   );
            argv_local._4_4_ = aVar1;
          }
        }
      }
      else {
        fprintf(_stderr,"Failure in line %d in file %s\n",0x100,
                "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/tests/src/vec-ops.c"
               );
        argv_local._4_4_ = op_backend._4_4_;
      }
    }
    else {
      fprintf(_stderr,"Failure in line %d in file %s\n",0xfd,
              "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/tests/src/vec-ops.c"
             );
      argv_local._4_4_ = mem_backend._4_4_;
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv)
{
  struct axbHandle_s *axbHandle;
  const char *mem_backend_name = argv[1];
  const char *op_backend_name = argv[2];

  if (argc < 2) {
    fprintf(stderr, "Missing argument: MemoryBackend\n");
    return EXIT_FAILURE;
  }
  else if (argc == 2) { // mem backend equals op backend
    op_backend_name = argv[1];
  }

  printf("Initializing libaxb...\n");
  AXB_ERR_CHECK(axbInit(&axbHandle));

  struct axbMemBackend_s *mem_backend;
  AXB_ERR_CHECK(axbMemBackendGetByName(axbHandle, &mem_backend, mem_backend_name));
  if (!mem_backend) {
    fprintf(stderr, "ERROR: Cannot find memory backend %s\n", mem_backend_name);
    return EXIT_FAILURE;
  }
  printf("Using memory backend %s\n", mem_backend_name);

  struct axbOpBackend_s *op_backend;
  AXB_ERR_CHECK(axbOpBackendGetByName(axbHandle, &op_backend, op_backend_name));
  if (!op_backend) {
    fprintf(stderr, "ERROR: Cannot find memory backend %s\n", mem_backend_name);
    return EXIT_FAILURE;
  }
  printf("Using op backend %s\n", op_backend_name);

  setup(axbHandle, mem_backend, op_backend);


  printf("Shutting down libaxb...\n");
  AXB_ERR_CHECK(axbFinalize(axbHandle));

  printf("Completed successfully\n");

  return EXIT_SUCCESS;
}